

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void separatetobefnz(global_State *g,int all)

{
  GCObject *pGVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  
  pGVar1 = (GCObject *)&g->tobefnz;
  do {
    pGVar3 = pGVar1;
    pGVar1 = pGVar3->next;
  } while (pGVar1 != (GCObject *)0x0);
  pGVar1 = (GCObject *)&g->finobj;
  while (pGVar4 = pGVar1, pGVar1 = pGVar4->next, pGVar1 != g->finobjold1) {
    if ((all != 0) || ((pGVar1->marked & 0x18) != 0)) {
      pGVar2 = pGVar1->next;
      if (pGVar1 == g->finobjsur) {
        g->finobjsur = pGVar2;
      }
      pGVar4->next = pGVar2;
      pGVar1->next = pGVar3->next;
      pGVar3->next = pGVar1;
      pGVar3 = pGVar1;
      pGVar1 = pGVar4;
    }
  }
  return;
}

Assistant:

static void separatetobefnz (global_State *g, int all) {
  GCObject *curr;
  GCObject **p = &g->finobj;
  GCObject **lastnext = findlast(&g->tobefnz);
  while ((curr = *p) != g->finobjold1) {  /* traverse all finalizable objects */
    lua_assert(tofinalize(curr));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &curr->next;  /* don't bother with it */
    else {
      if (curr == g->finobjsur)  /* removing 'finobjsur'? */
        g->finobjsur = curr->next;  /* correct it */
      *p = curr->next;  /* remove 'curr' from 'finobj' list */
      curr->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &curr->next;
    }
  }
}